

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

size_t __thiscall
google::protobuf::internal::DynamicMapField::SpaceUsedExcludingSelfNoLock(DynamicMapField *this)

{
  bool bVar1;
  CppType CVar2;
  MapKey *this_00;
  const_pointer pvVar3;
  Message *this_01;
  Reflection *this_02;
  size_t sVar4;
  Message *message;
  undefined1 local_38 [8];
  const_iterator it;
  size_t map_size;
  size_t size;
  DynamicMapField *this_local;
  
  map_size = 0;
  if ((this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
      .super_MapFieldBase.repeated_field_ != (RepeatedPtrField<google::protobuf::Message> *)0x0) {
    map_size = RepeatedPtrField<google::protobuf::Message>::SpaceUsedExcludingSelfLong
                         ((this->
                          super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                          ).super_MapFieldBase.repeated_field_);
  }
  map_size = map_size + 0x30;
  it.it_.bucket_index_ =
       Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::size(&this->map_);
  if (it.it_.bucket_index_ != 0) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
              ((const_iterator *)local_38,&this->map_);
    map_size = it.it_.bucket_index_ * 0x38 + map_size;
    this_00 = (MapKey *)
              Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
              operator->((const_iterator *)local_38);
    CVar2 = MapKey::type(this_00);
    if (CVar2 == CPPTYPE_STRING) {
      map_size = it.it_.bucket_index_ * 0x20 + map_size;
    }
    pvVar3 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
             operator->((const_iterator *)local_38);
    CVar2 = MapValueConstRef::type((MapValueConstRef *)(pvVar3 + 0x28));
    switch(CVar2) {
    case CPPTYPE_INT32:
      map_size = it.it_.bucket_index_ * 4 + map_size;
      break;
    case CPPTYPE_INT64:
      map_size = it.it_.bucket_index_ * 8 + map_size;
      break;
    case CPPTYPE_UINT32:
      map_size = it.it_.bucket_index_ * 4 + map_size;
      break;
    case CPPTYPE_UINT64:
      map_size = it.it_.bucket_index_ * 8 + map_size;
      break;
    case CPPTYPE_DOUBLE:
      map_size = it.it_.bucket_index_ * 8 + map_size;
      break;
    case CPPTYPE_FLOAT:
      map_size = it.it_.bucket_index_ * 4 + map_size;
      break;
    case CPPTYPE_BOOL:
      map_size = it.it_.bucket_index_ + map_size;
      break;
    case CPPTYPE_ENUM:
      map_size = it.it_.bucket_index_ * 4 + map_size;
      break;
    case CPPTYPE_STRING:
      map_size = it.it_.bucket_index_ * 0x20 + map_size;
      break;
    case CPPTYPE_MESSAGE:
      while( true ) {
        Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end
                  ((const_iterator *)&message,&this->map_);
        bVar1 = protobuf::operator!=((const_iterator *)local_38,(const_iterator *)&message);
        if (!bVar1) break;
        pvVar3 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
                 operator->((const_iterator *)local_38);
        this_01 = MapValueConstRef::GetMessageValue((MapValueConstRef *)(pvVar3 + 0x28));
        this_02 = Message::GetReflection(this_01);
        sVar4 = Reflection::SpaceUsedLong(this_02,this_01);
        map_size = sVar4 + map_size;
        Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator++
                  ((const_iterator *)local_38);
      }
    }
  }
  return map_size;
}

Assistant:

size_t DynamicMapField::SpaceUsedExcludingSelfNoLock() const {
  size_t size = 0;
  if (MapFieldBase::repeated_field_ != nullptr) {
    size += MapFieldBase::repeated_field_->SpaceUsedExcludingSelfLong();
  }
  size += sizeof(map_);
  size_t map_size = map_.size();
  if (map_size) {
    Map<MapKey, MapValueRef>::const_iterator it = map_.begin();
    size += sizeof(it->first) * map_size;
    size += sizeof(it->second) * map_size;
    // If key is string, add the allocated space.
    if (it->first.type() == FieldDescriptor::CPPTYPE_STRING) {
      size += sizeof(std::string) * map_size;
    }
    // Add the allocated space in MapValueRef.
    switch (it->second.type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)           \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: { \
    size += sizeof(TYPE) * map_size;         \
    break;                                   \
  }
      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(STRING, std::string);
      HANDLE_TYPE(ENUM, int32_t);
#undef HANDLE_TYPE
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        while (it != map_.end()) {
          const Message& message = it->second.GetMessageValue();
          size += message.GetReflection()->SpaceUsedLong(message);
          ++it;
        }
        break;
      }
    }
  }
  return size;
}